

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaParams.cpp
# Opt level: O3

void __thiscall
NaParams::NaParams(NaParams *this,char *szFileName,int argc,char **argv,char *szSpecChar)

{
  char cVar1;
  item_t *__base;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  item_t *piVar8;
  char *pcVar9;
  void *pvVar10;
  char **ppcVar11;
  size_t sVar12;
  undefined4 *puVar13;
  long lVar14;
  item_t *piVar15;
  ulong uVar16;
  FILE *unaff_R15;
  char *value;
  char *name;
  char szAbsent [8];
  char *local_80;
  uint local_74;
  FILE *local_70;
  item_t *local_68;
  char *local_60;
  char **local_58;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  this->_vptr_NaParams = (_func_int **)&PTR__NaParams_00177c48;
  local_58 = argv;
  if (szSpecChar == (char *)0x0) {
    puVar13 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar13 = 0;
LAB_0015574a:
    __cxa_throw(puVar13,&NaException::typeinfo,0);
  }
  this->spec[0] = *szSpecChar;
  this->spec[1] = szSpecChar[1];
  this->stored_n = 0;
  local_74 = argc;
  if (szFileName != (char *)0x0) {
    pcVar5 = strdup(szFileName);
    pcVar6 = strstr(pcVar5,".par");
    if ((pcVar6 != (char *)0x0) && (pcVar6[4] == '\0')) {
      NaCloseLogFile();
      builtin_strncpy(pcVar6,".log",5);
      pcVar7 = strrchr(pcVar5,0x2f);
      pcVar6 = pcVar5 + -1;
      if (pcVar7 != (char *)0x0) {
        pcVar6 = pcVar7;
      }
      NaOpenLogFile(pcVar6 + 1);
    }
    free(pcVar5);
    local_70 = (FILE *)szFileName;
    unaff_R15 = fopen(szFileName,"rb");
    if (unaff_R15 == (FILE *)0x0) {
      puVar13 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar13 = 5;
      goto LAB_0015574a;
    }
    pcVar5 = this->buf;
    pcVar6 = fgets(pcVar5,0x3ff,unaff_R15);
    if (pcVar6 != (char *)0x0) {
      do {
        iVar4 = this->stored_n;
        pcVar6 = pcVar5;
        if ((iVar4 == 0) && (this->buf[2] == -0x41 && *(short *)pcVar5 == -0x4411)) {
          pcVar6 = this->buf + 3;
        }
        do {
          cVar1 = *pcVar6;
          iVar3 = isspace((int)cVar1);
          if (cVar1 == '\0') break;
          pcVar6 = pcVar6 + 1;
        } while (iVar3 != 0);
        if ((cVar1 != '\0') && (cVar1 != this->spec[0])) {
          this->stored_n = iVar4 + 1;
        }
        pcVar6 = fgets(pcVar5,0x3ff,unaff_R15);
      } while (pcVar6 != (char *)0x0);
    }
    rewind(unaff_R15);
    szFileName = (char *)local_70;
  }
  iVar4 = this->stored_n;
  if (local_58 != (char **)0x0 && 0 < (int)local_74) {
    iVar4 = iVar4 + local_74;
    this->stored_n = iVar4;
  }
  if (iVar4 == 0) {
    NaPrintLog("File \'%s\' does not contain parameters.\n",szFileName);
    this->storage = (item_t *)0x0;
  }
  else {
    local_50 = 0x746e657362613f;
    uVar16 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar16 = (long)iVar4 << 4;
    }
    piVar8 = (item_t *)operator_new__(uVar16);
    this->storage = piVar8;
    this->stored_n = 0;
    pcVar5 = this->buf;
    pcVar9 = fgets(pcVar5,0x3ff,unaff_R15);
    pcVar7 = pcVar5;
    local_70 = unaff_R15;
    pcVar6 = local_38;
    while (local_38 = pcVar7, pcVar9 != (char *)0x0) {
      bVar2 = parse_line(this,pcVar5,&local_60,&local_80);
      pcVar6 = local_60;
      if (bVar2) {
LAB_001553e9:
        pcVar7 = local_80;
        NaPrintLog("name=\'%s\' value=\'%s\' ",local_60,local_80);
        local_48 = pcVar6;
        local_40 = 0;
        pvVar10 = bsearch(&local_48,this->storage,(long)this->stored_n,0x10,stored_cmp);
        if (pvVar10 == (void *)0x0) {
          sVar12 = strlen(pcVar6);
          pcVar5 = (char *)operator_new__(sVar12 + 1);
          local_68 = this->storage;
          lVar14 = (long)this->stored_n;
          local_68[lVar14].name = pcVar5;
          strcpy(pcVar5,pcVar6);
          sVar12 = strlen(pcVar7);
          pcVar5 = (char *)operator_new__(sVar12 + 1);
          piVar8 = local_68;
          unaff_R15 = local_70;
          local_68[lVar14].value = pcVar5;
          strcpy(pcVar5,pcVar7);
          pcVar5 = local_38;
          this->stored_n = (int)(lVar14 + 1U);
          qsort(piVar8,lVar14 + 1U,0x10,stored_cmp);
          pcVar6 = "APPEND\n";
        }
        else {
          ppcVar11 = FetchParam(this,pcVar6);
          if (*ppcVar11 != (char *)0x0) {
            operator_delete__(*ppcVar11);
          }
          sVar12 = strlen(pcVar7);
          pcVar6 = (char *)operator_new__(sVar12 + 1);
          *ppcVar11 = pcVar6;
          strcpy(pcVar6,pcVar7);
          pcVar6 = "REPLACE\n";
        }
        NaPrintLog(pcVar6);
      }
      else if (local_60 != (char *)0x0) {
        local_80 = (char *)&local_50;
        goto LAB_001553e9;
      }
      pcVar9 = fgets(pcVar5,0x3ff,unaff_R15);
      pcVar7 = local_38;
      pcVar6 = local_38;
    }
    local_38 = pcVar6;
    if (0 < (int)local_74) {
      piVar8 = (item_t *)(ulong)local_74;
      piVar15 = (item_t *)0x0;
      local_68 = piVar8;
      do {
        bVar2 = parse_line(this,local_58[(long)piVar15],&local_60,&local_80);
        pcVar5 = local_60;
        if (bVar2) {
LAB_0015558b:
          pcVar6 = local_80;
          NaPrintLog("cmd.line: name=\'%s\' value=\'%s\' ",local_60,local_80);
          local_48 = pcVar5;
          local_40 = 0;
          pvVar10 = bsearch(&local_48,this->storage,(long)this->stored_n,0x10,stored_cmp);
          if (pvVar10 == (void *)0x0) {
            sVar12 = strlen(pcVar5);
            pcVar7 = (char *)operator_new__(sVar12 + 1);
            __base = this->storage;
            lVar14 = (long)this->stored_n;
            __base[lVar14].name = pcVar7;
            strcpy(pcVar7,pcVar5);
            sVar12 = strlen(pcVar6);
            pcVar5 = (char *)operator_new__(sVar12 + 1);
            piVar8 = local_68;
            __base[lVar14].value = pcVar5;
            strcpy(pcVar5,pcVar6);
            unaff_R15 = local_70;
            this->stored_n = (int)(lVar14 + 1U);
            qsort(__base,lVar14 + 1U,0x10,stored_cmp);
            pcVar5 = "APPEND\n";
          }
          else {
            ppcVar11 = FetchParam(this,pcVar5);
            if (*ppcVar11 != (char *)0x0) {
              operator_delete__(*ppcVar11);
            }
            sVar12 = strlen(pcVar6);
            pcVar5 = (char *)operator_new__(sVar12 + 1);
            *ppcVar11 = pcVar5;
            strcpy(pcVar5,pcVar6);
            pcVar5 = "REPLACE\n";
          }
          NaPrintLog(pcVar5);
        }
        else if (local_60 != (char *)0x0) {
          local_80 = (char *)&local_50;
          goto LAB_0015558b;
        }
        piVar15 = (item_t *)((long)&piVar15->name + 1);
      } while (piVar8 != piVar15);
    }
  }
  fclose(unaff_R15);
  qsort(this->storage,(long)this->stored_n,0x10,stored_cmp);
  return;
}

Assistant:

NaParams::NaParams (const char* szFileName,
		    /* Extra values in format argv[i]=" name = value " */
		    int argc, char** argv,
		    const char szSpecChar[2])
{
  if(NULL == szSpecChar)
    throw(na_null_pointer);

  spec[COMMENT] = szSpecChar[COMMENT];
  spec[ASSIGN] = szSpecChar[ASSIGN];

  FILE	*fp;
  stored_n = 0;

  if(NULL != szFileName)
    {
      // open special logfile derived from name of parameter
      char	*szPath = strdup(szFileName);
      char	*szExt = strstr(szPath, ".par");
      if(NULL != szExt && szExt[4] == '\0')
	{
	  // let's replace log file with new one but in current directory
	  NaCloseLogFile();
	  strcpy(szExt, ".log");
	  char	*szFile = strrchr(szPath, '/');
	  if(NULL == szFile)
	    /* local already */
	    szFile = szPath - 1;
	  NaOpenLogFile(szFile + 1);
	}
      free(szPath);

      // open file
      fp = fopen(szFileName, "rb"); // rt
      if(NULL == fp)
	throw(na_cant_open_file);

      // read file to get high estimation for number of lines in it
      while(NULL != fgets(buf, NaPARAM_LINE_MAX_LEN, fp))
	{
	  // skip leading spaces
	  char	*p;

	  p = buf;

	  if(0 == stored_n &&
	     !strncmp(p, NaBOM_utf8, strlen(NaBOM_utf8))){
	      // BOM is found -> it's OK
	      p += strlen(NaBOM_utf8);
	  }

	  // skip leading spaces before name
	  while(isspace(*p) && *p != '\0')
	    ++p;
	  if(*p != '\0' && *p != spec[COMMENT])
	    // non-empty line
	    ++stored_n;
	  // else
	  //   no name in this line due to empty line
	}

      // rewind file
      rewind(fp);
    }

  if(argc > 0 && argv != NULL)
    {
      // add lines for additional arguments in command line
      stored_n += argc;
    }

  // allocate storage
  if(0 == stored_n)
    {
      NaPrintLog("File '%s' does not contain parameters.\n",
		 szFileName);
      storage = NULL;
    }
  else
    {
      char	*name, *value;
      char	szAbsent[] = "?absent";
      storage = new item_t[stored_n];

      //int	item_i = 0;
      stored_n = 0;

      // read file to the storage
      while(NULL != fgets(buf, NaPARAM_LINE_MAX_LEN, fp))
	{
	  // parse line of text
	  if(!parse_line(buf, name, value))
	    {
	      if(NULL == name)
		// comment line
		continue;
	      // empty value
	      value = szAbsent;
	    }

	  NaPrintLog("name='%s' value='%s' ", name, value);

	  if(CheckParam(name))
	    {
	      // already exist -> replace value
	      char*&	value_ref = FetchParam(name);
	      delete[] value_ref;

	      value_ref = new char[strlen(value) + 1];
	      strcpy(value_ref, value);

	      NaPrintLog("REPLACE\n");
	    }
	  else
	    {
	      // not exist
	      storage[stored_n].name = new char[strlen(name) + 1];
	      strcpy(storage[stored_n].name, name);

	      storage[stored_n].value = new char[strlen(value) + 1];
	      strcpy(storage[stored_n].value, value);

	      // go to next command line argument and next item
	      ++stored_n;

	      // quick sort the storage to have proper order
	      qsort(storage, stored_n, sizeof(item_t), stored_cmp);

	      NaPrintLog("APPEND\n");
	    }
	}

      // parse additional arguments from command line
      int	i;
      for(i = 0; i < argc; ++i)
	{
	  // parse command line argument
	  if(!parse_line(argv[i], name, value))
	    {
	      if(NULL == name)
		// comment line
		continue;
	      // empty value
	      value = szAbsent;
	    }

	  NaPrintLog("cmd.line: name='%s' value='%s' ", name, value);

	  if(CheckParam(name))
	    {
	      // already exist -> replace value
	      char*&	value_ref = FetchParam(name);
	      delete[] value_ref;

	      value_ref = new char[strlen(value) + 1];
	      strcpy(value_ref, value);

	      NaPrintLog("REPLACE\n");
	    }
	  else
	    {
	      // not exist
	      storage[stored_n].name = new char[strlen(name) + 1];
	      strcpy(storage[stored_n].name, name);

	      storage[stored_n].value = new char[strlen(value) + 1];
	      strcpy(storage[stored_n].value, value);

	      // go to next command line argument and next item
	      ++stored_n;

	      // quick sort the storage to have proper order
	      qsort(storage, stored_n, sizeof(item_t), stored_cmp);

	      NaPrintLog("APPEND\n");
	    }
	}

      //stored_n = item_i;
    }

  fclose(fp);

  // quick sort the storage
  qsort(storage, stored_n, sizeof(item_t), stored_cmp);
}